

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextGLImpl::DvpValidateCommittedShaderResources(DeviceContextGLImpl *this)

{
  PipelineStateGLImpl *this_00;
  function<Diligent::PipelineResourceSignatureGLImpl_*(unsigned_int)> local_30;
  DeviceContextGLImpl *local_10;
  DeviceContextGLImpl *this_local;
  
  if (((this->m_BindInfo).super_CommittedShaderResources.ResourcesValidated & 1U) == 0) {
    local_10 = this;
    std::function<Diligent::PipelineResourceSignatureGLImpl_*(unsigned_int)>::function
              (&local_30,(nullptr_t)0x0);
    DeviceContextBase<Diligent::EngineGLImplTraits>::DvpVerifySRBCompatibility
              (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,
               &(this->m_BindInfo).super_CommittedShaderResources,&local_30);
    std::function<Diligent::PipelineResourceSignatureGLImpl_*(unsigned_int)>::~function(&local_30);
    this_00 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator->
                        (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                          m_pPipelineState);
    PipelineStateGLImpl::DvpVerifySRBResources
              (this_00,(ShaderResourceCacheArrayType *)&this->m_BindInfo,
               (BaseBindingsArrayType *)
               &(this->m_BindInfo).super_CommittedShaderResources.field_0xe4);
    (this->m_BindInfo).super_CommittedShaderResources.ResourcesValidated = true;
  }
  return;
}

Assistant:

void DeviceContextGLImpl::DvpValidateCommittedShaderResources()
{
    if (m_BindInfo.ResourcesValidated)
        return;

    DvpVerifySRBCompatibility(m_BindInfo);

    m_pPipelineState->DvpVerifySRBResources(m_BindInfo.ResourceCaches, m_BindInfo.BaseBindings);
    m_BindInfo.ResourcesValidated = true;
}